

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O1

void __thiscall CaDiCaL::Terminal::color(Terminal *this,int color,bool bright)

{
  if (this->use_colors == true) {
    fputs("\x1b[",(FILE *)this->file);
    fputc(bright | 0x30,(FILE *)this->file);
    fprintf((FILE *)this->file,";%dm",color);
    fflush((FILE *)this->file);
    return;
  }
  return;
}

Assistant:

void color (int color, bool bright) {
    if (!use_colors)
      return;
    assert (connected);
    escape ();
    fputc (bright ? '1' : '0', file);
    fprintf (file, ";%dm", color);
    fflush (file);
  }